

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddRoundedBoxGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,ChVector<double> *size,
               double srad,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  element_type *peVar1;
  ChBody *this;
  shared_ptr<chrono::ChVisualModel> model;
  __shared_ptr<chrono::ChRoundedBoxShape,_(__gnu_cxx::_Lock_policy)2> local_148;
  double local_138;
  ChQuaternion<double> *local_130;
  ChBody *local_128;
  double local_120;
  double local_118;
  double local_110;
  shared_ptr<chrono::ChVisualShape> local_108;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_c8;
  ChFrame<double> local_b8;
  
  local_138 = srad;
  local_128 = body;
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_148,
             &(body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = local_148._M_ptr;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
             (local_f8 + 0x10),
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_110 = size->m_data[0];
  local_118 = size->m_data[1];
  local_120 = size->m_data[2];
  local_130 = rot;
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&local_b8,rot);
  (*(peVar1->super_ChVisualShape)._vptr_ChVisualShape[0xc])
            (local_110,local_118,local_120,local_138,peVar1,local_f8 + 0x10,pos,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  this = local_128;
  if (visualization) {
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    if ((element_type *)local_b8._vptr_ChFrame == (element_type *)0x0) {
      std::make_shared<chrono::ChVisualModel>();
      std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_c8,
                 (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
      ChPhysicsItem::AddVisualModel
                (&this->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    }
    chrono_types::make_shared<chrono::ChRoundedBoxShape,_0>();
    if (&((local_148._M_ptr)->groundedbox).Size != size) {
      ((local_148._M_ptr)->groundedbox).Size.m_data[0] = size->m_data[0];
      ((local_148._M_ptr)->groundedbox).Size.m_data[1] = size->m_data[1];
      ((local_148._M_ptr)->groundedbox).Size.m_data[2] = size->m_data[2];
    }
    ((local_148._M_ptr)->groundedbox).radsphere = local_138;
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,
               &vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>);
    ChVisualShape::AddMaterial
              (&(local_148._M_ptr)->super_ChVisualShape,
               (shared_ptr<chrono::ChVisualMaterial> *)&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_f8);
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChRoundedBoxShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_108,
               &local_148);
    ChFrame<double>::ChFrame(&local_b8,pos,local_130);
    ChVisualModel::AddShape((ChVisualModel *)local_f8._0_8_,&local_108,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  }
  return;
}

Assistant:

void AddRoundedBoxGeometry(ChBody* body,
                           std::shared_ptr<ChMaterialSurface> material,
                           const ChVector<>& size,
                           double srad,
                           const ChVector<>& pos,
                           const ChQuaternion<>& rot,
                           bool visualization,
                           std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddRoundedBox(material, size.x(), size.y(), size.z(), srad, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto box = chrono_types::make_shared<ChRoundedBoxShape>();
        box->GetRoundedBoxGeometry().Size = size;
        box->GetRoundedBoxGeometry().radsphere = srad;
        box->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(box, ChFrame<>(pos, rot));
    }
}